

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

int __thiscall JetHead::Directory::open(Directory *this,char *__file,int __oflag,...)

{
  uint uVar1;
  char *pcVar2;
  DIR *pDVar3;
  Path *this_00;
  uint local_144;
  dirent *pdStack_140;
  int i;
  dirent *dir_ptr;
  dirent dir;
  Path *p_local;
  Directory *this_local;
  Directory *pDVar4;
  
  if (this->mDirHandle == (void *)0x0) {
    dir._272_8_ = __file;
    Path::getString_abi_cxx11_((Path *)__file);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pDVar3 = opendir(pcVar2);
    this->mDirHandle = pDVar3;
    vector<JetHead::Path>::reserve(&this->mData,0x32);
    pdStack_140 = (dirent *)&dir_ptr;
    local_144 = 0;
    while (pdStack_140 != (dirent *)0x0 && (int)local_144 < 0x32) {
      uVar1 = readdir_r((DIR *)this->mDirHandle,(dirent *)&dir_ptr,&stack0xfffffffffffffec0);
      pDVar4 = (Directory *)(ulong)uVar1;
      if (uVar1 != 0) {
        this_local._7_1_ = 0;
        goto LAB_001237dd;
      }
      if (pdStack_140 != (dirent *)0x0) {
        pcVar2 = pdStack_140->d_name;
        this_00 = vector<JetHead::Path>::operator[](&this->mData,local_144);
        Path::operator=(this_00,pcVar2);
        local_144 = local_144 + 1;
      }
    }
    pDVar4 = (Directory *)0x0;
    if (pdStack_140 == (dirent *)0x0) {
      this->mNumberEntries = local_144 + 1;
      pDVar4 = this;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
    pDVar4 = this;
  }
LAB_001237dd:
  return (int)CONCAT71((int7)((ulong)pDVar4 >> 8),this_local._7_1_);
}

Assistant:

bool Directory::open( const Path &p )
{
	if ( mDirHandle != NULL )
		return false;

	mDirHandle = opendir( p.getString().c_str() );

	mData.reserve( gNumberEntries );

	struct dirent dir;
	struct dirent *dir_ptr = &dir;
	int i = 0;

	// fill with the first gNumberEntries files.  This is done to keep this
	//  from taking too much time if the directory has 1000's of files.
	while ( dir_ptr != NULL && i < gNumberEntries )
	{
		if ( readdir_r( DIR_HANDLE, &dir, &dir_ptr ) != 0 )
			return false;

		if ( dir_ptr != NULL )
		{
			mData[ i ] = dir_ptr->d_name;
			i += 1;
		}
	}

	if ( dir_ptr == NULL )
		mNumberEntries = i + 1;

	return true;
}